

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel.cpp
# Opt level: O3

bool __thiscall
QSqlQueryModel::setHeaderData
          (QSqlQueryModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  QList<QHash<int,_QVariant>_> *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  pointer pQVar4;
  long in_FS_OFFSET;
  int local_54;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_54 = role;
  if (-1 < section && orientation == Horizontal) {
    lVar1 = *(long *)&this->field_0x8;
    local_50.iterator.i.d = (Data<QHashPrivate::Node<int,_QVariant>_> *)0xffffffffffffffff;
    local_50.iterator.i.bucket = 0;
    local_50.inserted = false;
    local_50._17_7_ = 0;
    iVar3 = (**(code **)(*(long *)this + 0x80))();
    if (section < iVar3) {
      this_00 = (QList<QHash<int,_QVariant>_> *)(lVar1 + 0x110);
      if (*(ulong *)(lVar1 + 0x120) <= (ulong)(uint)section) {
        iVar3 = 0xf;
        if (0xf < (uint)section) {
          iVar3 = section;
        }
        QList<QHash<int,_QVariant>_>::resize(this_00,(ulong)(iVar3 + 1));
      }
      pQVar4 = QList<QHash<int,_QVariant>_>::data(this_00);
      QHash<int,QVariant>::tryEmplace_impl<int_const&>(&local_50,pQVar4 + (uint)section,&local_54);
      QVariant::operator=((QVariant *)
                          ((local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries
                           [(local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                            [(uint)local_50.iterator.i.bucket & 0x7f]].storage.data + 8),value);
      QAbstractItemModel::headerDataChanged((Orientation)this,1,section);
      bVar2 = true;
      goto LAB_0012d132;
    }
  }
  bVar2 = false;
LAB_0012d132:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlQueryModel::setHeaderData(int section, Qt::Orientation orientation,
                                   const QVariant &value, int role)
{
    Q_D(QSqlQueryModel);
    if (orientation != Qt::Horizontal || section < 0 || columnCount() <= section)
        return false;

    if (d->headers.size() <= section)
        d->headers.resize(qMax(section + 1, 16));
    d->headers[section][role] = value;
    emit headerDataChanged(orientation, section, section);
    return true;
}